

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

char __thiscall
duckdb::Interpolator<true>::
Interpolate<unsigned_long,signed_char,duckdb::QuantileIndirect<signed_char>>
          (Interpolator<true> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<signed_char> *accessor)

{
  RESULT_TYPE input;
  char cVar1;
  unsigned_long local_8;
  
  local_8 = lidx;
  input = QuantileIndirect<signed_char>::operator()(accessor,&local_8);
  cVar1 = Cast::Operation<signed_char,signed_char>(input);
  return cVar1;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
	}